

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

void rf_draw_text(char *text,int posX,int posY,int font_size,rf_color color)

{
  size_t sVar1;
  
  sVar1 = strlen(text);
  rf_draw_string(text,(int)sVar1,posX,posY,font_size,color);
  return;
}

Assistant:

RF_API void rf_draw_text(const char* text, int posX, int posY, int font_size, rf_color color) { rf_draw_string(text, strlen(text), posX, posY, font_size, color); }